

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::QName::getRawName(QName *this)

{
  int iVar1;
  undefined4 extraout_var;
  XMLSize_t count;
  long lVar2;
  ulong uVar3;
  XMLSize_t prefixLen;
  XMLSize_t neededLen;
  QName *this_local;
  
  if ((this->fRawName == (XMLCh *)0x0) || (*this->fRawName == L'\0')) {
    if (*this->fPrefix == L'\0') {
      return this->fLocalPart;
    }
    lVar2 = this->fPrefixBufSz + this->fLocalPartBufSz;
    uVar3 = lVar2 + 1;
    if ((this->fRawName == (XMLCh *)0x0) || (this->fRawNameBufSz < uVar3)) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fRawName);
      this->fRawName = (XMLCh *)0x0;
      this->fRawNameBufSz = uVar3;
      iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(lVar2 + 2) * 2);
      this->fRawName = (XMLCh *)CONCAT44(extraout_var,iVar1);
      *this->fRawName = L'\0';
    }
    count = XMLString::stringLen(this->fPrefix);
    XMLString::moveChars(this->fRawName,this->fPrefix,count);
    this->fRawName[count] = L':';
    XMLString::copyString(this->fRawName + count + 1,this->fLocalPart);
  }
  return this->fRawName;
}

Assistant:

XMLCh* QName::getRawName()
{
    //
    //  If there is no buffer, or if there is but we've not faulted in the
    //  value yet, then we have to do that now.
    //
    if (!fRawName || !*fRawName)
    {
        //
        //  If we have a prefix, then do the prefix:name version. Else, its
        //  just the name.
        //
        if (*fPrefix)
        {
            //
            //  Calculate the worst case size buffer we will need. We use the
            //  current high water marks of the prefix and name buffers, so it
            //  might be a little wasteful of memory but we don't have to do
            //  string len operations on the two strings.
            //
            const XMLSize_t neededLen = fPrefixBufSz + fLocalPartBufSz + 1;

            //
            //  If no buffer, or the current one is too small, then allocate one
            //  and get rid of any old one.
            //
            if (!fRawName || (neededLen > fRawNameBufSz))
            {
                fMemoryManager->deallocate(fRawName); //delete [] fRawName;
                
                fRawName = 0;
                // We have to cast off the const'ness to do this
                (const_cast<QName*>(this))->fRawNameBufSz = neededLen;
                (const_cast<QName*>(this))->fRawName = (XMLCh*) fMemoryManager->allocate
                (
                    (neededLen + 1) * sizeof(XMLCh)
                ); //new XMLCh[neededLen + 1];

                // Make sure its initially empty
                *fRawName = 0;
            }


            const XMLSize_t prefixLen = XMLString::stringLen(fPrefix);

            XMLString::moveChars(fRawName, fPrefix, prefixLen);
            fRawName[prefixLen] = chColon;
            XMLString::copyString(&fRawName[prefixLen+1], fLocalPart);
        }
         else
        {
            return fLocalPart;
        }
    }
    return fRawName;
}